

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O3

time_point absl::lts_20250127::ToChronoTime(Time t)

{
  time_point tVar1;
  uint32_t in_EDX;
  HiRep HVar2;
  Duration d;
  Duration DVar3;
  undefined1 auStack_10 [16];
  
  DVar3.rep_hi_.hi_ = (uint32_t)((ulong)register0x00000030 >> 0x20);
  DVar3.rep_hi_.lo_ = t.rep_.rep_lo_;
  HVar2 = t.rep_.rep_hi_;
  if (HVar2 == (HiRep)0x0) {
    DVar3.rep_lo_ = in_EDX;
    tVar1.__d.__r =
         time_internal::ToChronoDuration<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                   ((time_internal *)0x0,DVar3);
    return (time_point)tVar1.__d.__r;
  }
  if ((long)HVar2 < 0) {
    auStack_10._0_8_ = 0x33336c;
    DVar3 = Floor(t.rep_,(Duration)(ZEXT412(4) << 0x40));
    d.rep_lo_ = DVar3.rep_lo_;
    d.rep_hi_.hi_ = 0;
    d.rep_hi_.lo_ = d.rep_lo_;
    tVar1.__d.__r =
         time_internal::ToChronoDuration<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                   ((time_internal *)DVar3.rep_hi_,d);
    return (time_point)tVar1.__d.__r;
  }
  if (DVar3.rep_hi_.lo_ == 0xffffffff) {
    tVar1.__d.__r = (duration)-0x8000000000000000;
    if (-1 < (long)HVar2) {
      tVar1.__d.__r = (duration)0x7fffffffffffffff;
    }
    return (time_point)tVar1.__d.__r;
  }
  if ((ulong)HVar2 >> 0x21 == 0) {
    return (time_point)((ulong)(DVar3.rep_hi_.lo_ >> 2) + (long)HVar2 * 1000000000);
  }
  tVar1.__d.__r =
       (duration)IDivDuration(t.rep_,(Duration)(ZEXT412(4) << 0x40),(Duration *)(auStack_10 + 4));
  return (time_point)tVar1.__d.__r;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool operator<(Duration lhs,
                                                       Duration rhs) {
  return time_internal::GetRepHi(lhs) != time_internal::GetRepHi(rhs)
             ? time_internal::GetRepHi(lhs) < time_internal::GetRepHi(rhs)
         : time_internal::GetRepHi(lhs) == (std::numeric_limits<int64_t>::min)()
             ? time_internal::GetRepLo(lhs) + 1 <
                   time_internal::GetRepLo(rhs) + 1
             : time_internal::GetRepLo(lhs) < time_internal::GetRepLo(rhs);
}